

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O1

void mpc_sbox_verify_uint64_10(uint64_t *in,view_t *view,uint64_t *rvec)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  ulong uVar10;
  undefined1 auVar11 [16];
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  auVar13 = *(undefined1 (*) [16])in;
  auVar9 = *(undefined1 (*) [16])rvec;
  auVar11 = vpsllq_avx(auVar13,2);
  auVar17._8_8_ = 0x9249249000000000;
  auVar17._0_8_ = 0x9249249000000000;
  auVar2 = vpand_avx(auVar11,auVar17);
  auVar11 = vpaddq_avx(auVar13,auVar13);
  auVar11 = vpand_avx(auVar11,auVar17);
  auVar3 = vpand_avx(auVar13,auVar17);
  auVar14 = vpand_avx(auVar9,auVar17);
  auVar13 = vpsllq_avx(auVar9,2);
  auVar16 = vpand_avx(auVar13,auVar17);
  auVar13 = vpaddq_avx(auVar9,auVar9);
  auVar13 = vpand_avx(auVar13,auVar17);
  uVar12 = auVar11._0_8_;
  uVar4 = vpextrq_avx(auVar11,1);
  uVar7 = vpextrq_avx(auVar2,1);
  uVar6 = vpextrq_avx(auVar3,1);
  uVar10 = auVar3._0_8_;
  uVar8 = vpextrq_avx(auVar14,1);
  uVar8 = uVar8 ^ auVar14._0_8_ ^ uVar7 & uVar12 ^ (uVar4 ^ uVar12) & auVar2._0_8_;
  uVar1 = view->t[1];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar8;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar1 & 0x9249249000000000;
  auVar9 = vpunpcklqdq_avx(auVar9,auVar18);
  uVar5 = vpextrq_avx(auVar13,1);
  uVar4 = uVar5 ^ uVar12 & (uVar6 ^ uVar10) ^ auVar13._0_8_ ^ uVar4 & uVar10;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar4;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar1 * 2 & 0x9249249000000000;
  auVar13 = vpunpcklqdq_avx(auVar15,auVar19);
  uVar5 = vpextrq_avx(auVar16,1);
  uVar5 = uVar5 ^ auVar16._0_8_ ^ (uVar6 ^ uVar10) & auVar2._0_8_ ^ uVar10 & uVar7;
  view->t[0] = uVar5 >> 2 ^ uVar4 >> 1 ^ uVar8;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar5;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = (uVar1 & 0x2492492400000000) << 2;
  auVar14 = vpunpcklqdq_avx(auVar14,auVar16);
  auVar16 = vpsrlq_avx(auVar2 ^ auVar13,2);
  auVar13 = vpsrlq_avx(auVar11 ^ auVar2 ^ auVar14,1);
  auVar9 = vpternlogq_avx512vl(auVar13,auVar16,auVar9,0x96);
  auVar13._8_8_ = 0x3ffffffff;
  auVar13._0_8_ = 0x3ffffffff;
  auVar13 = vpternlogq_avx512vl(auVar9,*(undefined1 (*) [16])in,auVar13,0x78);
  auVar13 = vpternlogq_avx512vl(auVar13,auVar11 ^ auVar2,auVar3,0x96);
  *(undefined1 (*) [16])in = auVar13;
  return;
}

Assistant:

static void mpc_sbox_verify_uint64_10(uint64_t* in, view_t* view, uint64_t const* rvec) {
  bitsliced_step_1_uint64_10(SC_VERIFY);

  mpc_and_verify_uint64(r0m, x0s, x1s, r2m, view, MASK_X2I, 0);
  mpc_and_verify_uint64(r2m, x1s, x2m, r1s, view, MASK_X2I, 1);
  mpc_and_verify_uint64(r1m, x0s, x2m, r0s, view, MASK_X2I, 2);

  bitsliced_step_2_uint64_10(SC_VERIFY);
}